

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask31_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar9 [64];
  
  auVar6 = vpmovsxbd_avx512f(_DAT_0018ac70);
  auVar1 = *(undefined1 (*) [16])(in + 0xd);
  auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + 1));
  auVar5 = vpsrlvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_00193d20);
  auVar11 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 9),_DAT_00196ec0);
  auVar7 = vpsllvd_avx512f(auVar7,_DAT_001a6080);
  uVar2 = in[0x17];
  auVar4 = vpshufd_avx(auVar1,0xe9);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_00196ed0);
  auVar6 = vpermi2d_avx512f(auVar6,ZEXT3264(auVar5),ZEXT464(*in));
  auVar8 = vpmovsxbd_avx512f(_DAT_0018ac80);
  auVar6 = vpermi2d_avx512f(auVar8,auVar6,ZEXT1664(auVar11));
  auVar8 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar9 = vpbroadcastd_avx512f();
  auVar10._0_52_ = auVar6._0_52_;
  auVar10._52_4_ = auVar9._52_4_;
  auVar10._56_4_ = auVar6._56_4_;
  auVar10._60_4_ = auVar6._60_4_;
  uVar3 = *(ulong *)(in + 0x15);
  auVar6 = vpermi2q_avx512f(auVar8,auVar10,ZEXT1664(auVar4));
  auVar6 = vpord_avx512f(auVar7,auVar6);
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])out = auVar6;
  auVar4 = *(undefined1 (*) [16])(in + 0x11);
  auVar11 = vpsllvd_avx2(auVar4,_DAT_001a43f0);
  auVar1 = vpalignr_avx(auVar4,auVar1,0xc);
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_001a43e0);
  auVar1 = vpor_avx(auVar11,auVar1);
  *(undefined1 (*) [16])(out + 0x10) = auVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar1 = vpalignr_avx(auVar11,auVar4,0xc);
  auVar4 = vpsrlvd_avx2(auVar1,_DAT_001a4400);
  auVar1 = vpsllvd_avx2(auVar11,_DAT_001a4410);
  auVar1 = vpor_avx(auVar1,auVar4);
  *(long *)(out + 0x14) = auVar1._0_8_;
  out[0x16] = uVar2 << 9 | (uint)(uVar3 >> 0x36);
  out[0x17] = uVar2 >> 0x17;
  return out + 0x18;
}

Assistant:

uint32_t *__fastpackwithoutmask31_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (31 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (31 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (31 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (31 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (31 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (31 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (31 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (31 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (31 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (31 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (31 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (31 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (31 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (31 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (31 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (31 - 8);
  ++in;

  return out + 1;
}